

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_intersect(run_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  rle16_t *prVar5;
  rle16_t *prVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  _Bool _Var15;
  
  iVar3 = src_1->n_runs;
  prVar5 = src_1->runs;
  uVar1 = prVar5->value;
  if (uVar1 == 0 && iVar3 == 1) {
    bVar13 = prVar5->length == 0xffff;
  }
  else {
    bVar13 = false;
  }
  iVar4 = src_2->n_runs;
  prVar6 = src_2->runs;
  uVar2 = prVar6->value;
  if (uVar2 == 0 && iVar4 == 1) {
    bVar14 = prVar6->length == 0xffff;
  }
  else {
    bVar14 = false;
  }
  if (((bool)(bVar13 | bVar14)) && ((iVar9 = iVar4, bVar13 || (iVar9 = iVar3, bVar14)))) {
    _Var15 = iVar9 != 0;
  }
  else {
    iVar9 = 0;
    _Var15 = false;
    if (0 < iVar4 && 0 < iVar3) {
      uVar10 = (uint)uVar1;
      uVar11 = (uint)uVar2;
      uVar12 = (uint)uVar2 + (uint)prVar6->length + 1;
      uVar8 = (uint)uVar1 + (uint)prVar5->length + 1;
      iVar7 = 0;
      while( true ) {
        if (uVar11 < uVar8) {
          if (uVar10 < uVar12) {
            return true;
          }
          iVar9 = iVar9 + 1;
          if (iVar9 < iVar4) {
            uVar11 = (uint)prVar6[iVar9].value;
            uVar12 = (uint)prVar6[iVar9].value + (uint)prVar6[iVar9].length + 1;
          }
        }
        else {
          iVar7 = iVar7 + 1;
          if (iVar7 < iVar3) {
            uVar10 = (uint)prVar5[iVar7].value;
            uVar8 = (uint)prVar5[iVar7].value + (uint)prVar5[iVar7].length + 1;
          }
        }
        if (iVar3 <= iVar7) break;
        if (iVar4 <= iVar9) {
          return false;
        }
      }
      return false;
    }
  }
  return _Var15;
}

Assistant:

bool run_container_intersect(const run_container_t *src_1,
                             const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return !run_container_empty(src_2);
        }
        if (if2) {
            return !run_container_empty(src_1);
        }
    }
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            return true;
        }
    }
    return false;
}